

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::string_t,duckdb::string_t,bool,duckdb::BinaryStandardOperatorWrapper,duckdb::LikeOperator,bool,false,true>
               (string_t *ldata,string_t *rdata,bool *result_data,idx_t count,ValidityMask *mask,
               bool fun)

{
  anon_struct_16_3_d7536bce_for_pointer *paVar1;
  unsigned_long *puVar2;
  bool bVar3;
  char *pcVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t iVar8;
  char *pcVar9;
  ulong uVar10;
  ulong uVar11;
  char **ppcVar12;
  ulong uVar13;
  char **local_88;
  undefined8 local_80;
  char *local_78;
  undefined8 local_70;
  char *local_68;
  string_t *local_60;
  bool *local_58;
  ulong local_50;
  ulong local_48;
  ValidityMask *local_40;
  ulong local_38;
  
  local_60 = rdata;
  local_58 = result_data;
  local_48 = count;
  local_40 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar10 = *(ulong *)&rdata->value;
      pcVar9 = (rdata->value).pointer.ptr;
      local_88 = &(ldata->value).pointer.ptr;
      iVar8 = 0;
      uVar7 = uVar10 & 0xffffffff;
      do {
        paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(local_88 + -1);
        local_70._0_4_ = paVar1->length;
        local_70._4_1_ = paVar1->prefix[0];
        local_70._5_1_ = paVar1->prefix[1];
        local_70._6_1_ = paVar1->prefix[2];
        local_70._7_1_ = paVar1->prefix[3];
        local_68 = *local_88;
        pcVar5 = local_68;
        if ((local_70 & 0xffffffff) < 0xd) {
          pcVar5 = (char *)((long)&local_70 + 4);
        }
        pcVar4 = pcVar9;
        if (uVar7 < 0xd) {
          pcVar4 = (char *)((long)&local_80 + 4);
        }
        local_80 = uVar10;
        local_78 = pcVar9;
        bVar3 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                          (pcVar5,local_70 & 0xffffffff,pcVar4,uVar7,'\0');
        local_58[iVar8] = bVar3;
        iVar8 = iVar8 + 1;
        local_88 = local_88 + 2;
      } while (local_48 != iVar8);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_50 = count + 0x3f >> 6;
    local_38 = 0;
    uVar10 = 0;
    do {
      puVar2 = (local_40->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar7 = 0xffffffffffffffff;
      }
      else {
        uVar7 = puVar2[local_38];
      }
      uVar6 = uVar10 + 0x40;
      if (local_48 <= uVar10 + 0x40) {
        uVar6 = local_48;
      }
      uVar11 = uVar6;
      if (uVar7 != 0) {
        uVar11 = uVar10;
        if (uVar7 == 0xffffffffffffffff) {
          if (uVar10 < uVar6) {
            uVar7 = *(ulong *)&local_60->value;
            pcVar9 = (local_60->value).pointer.ptr;
            ppcVar12 = &ldata[uVar10].value.pointer.ptr;
            uVar13 = uVar7 & 0xffffffff;
            do {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar12 + -1);
              local_70._0_4_ = paVar1->length;
              local_70._4_1_ = paVar1->prefix[0];
              local_70._5_1_ = paVar1->prefix[1];
              local_70._6_1_ = paVar1->prefix[2];
              local_70._7_1_ = paVar1->prefix[3];
              local_68 = *ppcVar12;
              pcVar5 = local_68;
              if ((local_70 & 0xffffffff) < 0xd) {
                pcVar5 = (char *)((long)&local_70 + 4);
              }
              pcVar4 = pcVar9;
              if (uVar13 < 0xd) {
                pcVar4 = (char *)((long)&local_80 + 4);
              }
              local_80 = uVar7;
              local_78 = pcVar9;
              bVar3 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                (pcVar5,local_70 & 0xffffffff,pcVar4,uVar13,'\0');
              local_58[uVar10] = bVar3;
              uVar10 = uVar10 + 1;
              ppcVar12 = ppcVar12 + 2;
              uVar11 = uVar10;
            } while (uVar6 != uVar10);
          }
        }
        else if (uVar10 < uVar6) {
          ppcVar12 = &ldata[uVar10].value.pointer.ptr;
          uVar13 = 0;
          do {
            if ((uVar7 >> (uVar13 & 0x3f) & 1) != 0) {
              paVar1 = (anon_struct_16_3_d7536bce_for_pointer *)(ppcVar12 + -1);
              local_70._0_4_ = paVar1->length;
              local_70._4_1_ = paVar1->prefix[0];
              local_70._5_1_ = paVar1->prefix[1];
              local_70._6_1_ = paVar1->prefix[2];
              local_70._7_1_ = paVar1->prefix[3];
              local_68 = *ppcVar12;
              local_80 = *(ulong *)&local_60->value;
              local_78 = (local_60->value).pointer.ptr;
              pcVar9 = local_68;
              if ((local_70 & 0xffffffff) < 0xd) {
                pcVar9 = (char *)((long)&local_70 + 4);
              }
              pcVar5 = local_78;
              if ((local_80 & 0xffffffff) < 0xd) {
                pcVar5 = (char *)((long)&local_80 + 4);
              }
              bVar3 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                (pcVar9,local_70 & 0xffffffff,pcVar5,local_80 & 0xffffffff,'\0');
              local_58[uVar10] = bVar3;
            }
            uVar10 = uVar10 + 1;
            ppcVar12 = ppcVar12 + 2;
            uVar13 = uVar13 + 1;
            uVar11 = uVar10;
          } while (uVar6 != uVar10);
        }
      }
      local_38 = local_38 + 1;
      uVar10 = uVar11;
    } while (local_38 != local_50);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}